

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

void __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~CmdArgument(CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).field_2) {
    operator_delete(pcVar1);
  }
  CmdBase::~CmdBase(&this->super_CmdBase);
  operator_delete(this);
  return;
}

Assistant:

explicit CmdArgument(const std::string& name, const std::string& alternative, const std::string& description, bool required) : 
				CmdBase(name, alternative, description, required) {
			}